

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O1

void __thiscall jaegertracing::net::http::Header::Header(Header *this,string *key,string *value)

{
  pointer pcVar1;
  
  (this->_key)._M_dataplus._M_p = (pointer)&(this->_key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_value,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

Header(const std::string& key, const std::string& value)
        : _key(key)
        , _value(value)
    {
    }